

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::ConfigBase::to_config
          (ConfigBase *this,App *app,bool default_also,bool write_description,string *prefix)

{
  bool bVar1;
  int iVar2;
  reference ppOVar3;
  reference ppAVar4;
  ulong uVar5;
  size_t sVar6;
  string *psVar7;
  App *pAVar8;
  ostream *poVar9;
  byte in_CL;
  App *in_RDX;
  undefined8 *in_RSI;
  string *in_RDI;
  byte in_R8B;
  string *in_R9;
  undefined1 auVar10 [16];
  string outString;
  string pname;
  App *p;
  string appname;
  string subname;
  App *subcom_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *__range1_2;
  App *subcom;
  iterator __end1_1;
  iterator __begin1_1;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *__range1_1;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  string name;
  ArgumentMismatch *anon_var_0_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *test_name;
  const_iterator __end7;
  const_iterator __begin7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range7;
  bool valid;
  ArgumentMismatch *anon_var_0;
  bool isDefault;
  string value;
  results_t results;
  string single_name;
  Option *opt;
  iterator __end2;
  iterator __begin2;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *group;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  bool defaultUsed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  string keyChars;
  string commentTest;
  string commentLead;
  stringstream out;
  int in_stack_fffffffffffff508;
  undefined4 in_stack_fffffffffffff50c;
  undefined6 in_stack_fffffffffffff510;
  undefined1 in_stack_fffffffffffff516;
  char in_stack_fffffffffffff517;
  byte bVar11;
  byte bVar12;
  const_iterator in_stack_fffffffffffff518;
  App *in_stack_fffffffffffff520;
  undefined6 in_stack_fffffffffffff528;
  byte in_stack_fffffffffffff52e;
  byte in_stack_fffffffffffff52f;
  string *in_stack_fffffffffffff530;
  App *in_stack_fffffffffffff538;
  undefined6 in_stack_fffffffffffff540;
  byte in_stack_fffffffffffff546;
  byte in_stack_fffffffffffff547;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff548;
  App *in_stack_fffffffffffff550;
  Option *in_stack_fffffffffffff558;
  App *in_stack_fffffffffffff588;
  undefined8 in_stack_fffffffffffff590;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff598;
  undefined8 in_stack_fffffffffffff5b0;
  string *in_stack_fffffffffffff5d0;
  string *in_stack_fffffffffffff5d8;
  function<bool_(const_CLI::App_*)> *in_stack_fffffffffffff5f0;
  App *in_stack_fffffffffffff5f8;
  string *in_stack_fffffffffffff688;
  string *in_stack_fffffffffffff690;
  Option *in_stack_fffffffffffff698;
  Option *in_stack_fffffffffffff6b0;
  App *in_stack_fffffffffffff6b8;
  string local_890 [5];
  undefined1 in_stack_fffffffffffff775;
  char in_stack_fffffffffffff776;
  char in_stack_fffffffffffff777;
  string *in_stack_fffffffffffff778;
  string local_870 [32];
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [39];
  byte local_7a9;
  string local_7a8 [32];
  string local_788 [32];
  string local_768 [32];
  string local_748 [39];
  undefined1 local_721 [33];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  App *local_680;
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  App *local_5f8;
  App **local_5f0;
  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  local_5e8;
  undefined1 *local_5e0;
  string local_5d8 [32];
  string local_5b8 [32];
  App *local_598;
  App **local_590;
  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  local_588;
  undefined1 *local_580;
  undefined1 local_558 [24];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [48];
  undefined1 local_4b0 [16];
  string local_408 [32];
  string local_3e8 [32];
  string local_3c8 [32];
  string local_3a8 [32];
  string local_388 [39];
  byte local_361;
  string local_360 [56];
  string local_328 [32];
  Option *local_308;
  undefined4 local_2fc;
  Option **local_2f8;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  local_2f0 [5];
  undefined1 local_2c8 [24];
  undefined1 *local_2b0;
  reference local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2a0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_298;
  undefined1 *local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_288;
  allocator local_279;
  string local_278 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_258;
  byte local_241;
  undefined1 local_240 [24];
  string local_228 [39];
  allocator local_201;
  string local_200 [48];
  string local_1d0 [32];
  stringstream local_1b0 [16];
  string local_1a0 [12];
  byte local_1a;
  byte local_19;
  App *local_18;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  local_18 = in_RDX;
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  ::std::__cxx11::string::string(local_1d0);
  ::std::__cxx11::string::push_back((char)local_1d0);
  ::std::__cxx11::string::push_back((char)local_1d0);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_200,"#;",&local_201);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_201);
  ::std::__cxx11::string::push_back('\0');
  ::std::__cxx11::string::push_back('\0');
  ::std::__cxx11::string::string(local_228,local_200);
  ::std::__cxx11::string::push_back((char)local_228);
  ::std::__cxx11::string::push_back((char)local_228);
  ::std::__cxx11::string::push_back((char)local_228);
  ::std::__cxx11::string::push_back((char)local_228);
  ::std::__cxx11::string::push_back((char)local_228);
  ::std::__cxx11::string::push_back((char)local_228);
  App::get_groups_abi_cxx11_(in_stack_fffffffffffff588);
  local_241 = 0;
  local_258 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT17(in_stack_fffffffffffff517,
                         CONCAT16(in_stack_fffffffffffff516,in_stack_fffffffffffff510)),
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_278,"options",&local_279);
  local_288 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffff517,
                                   CONCAT16(in_stack_fffffffffffff516,in_stack_fffffffffffff510)),
                       in_stack_fffffffffffff518,
                       (value_type *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
  ::std::__cxx11::string::~string(local_278);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_279);
  local_290 = local_240;
  local_298._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
  local_2a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffff517,
                                   CONCAT16(in_stack_fffffffffffff516,in_stack_fffffffffffff510)),
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
    if (!bVar1) break;
    local_2a8 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_298);
    bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(in_stack_fffffffffffff517,
                                       CONCAT16(in_stack_fffffffffffff516,in_stack_fffffffffffff510)
                                      ),
                              (char *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508))
    ;
    if (bVar1) {
LAB_00121172:
      if ((local_241 & 1) == 0) {
        local_241 = 1;
        goto LAB_00121260;
      }
    }
    else {
      uVar5 = ::std::__cxx11::string::empty();
      if ((uVar5 & 1) != 0) goto LAB_00121172;
LAB_00121260:
      if ((local_1a & 1) != 0) {
        bVar1 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(in_stack_fffffffffffff517,
                                              CONCAT16(in_stack_fffffffffffff516,
                                                       in_stack_fffffffffffff510)),
                                  (char *)CONCAT44(in_stack_fffffffffffff50c,
                                                   in_stack_fffffffffffff508));
        if (bVar1) {
          uVar5 = ::std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            poVar9 = ::std::operator<<((ostream *)local_1a0,'\n');
            poVar9 = ::std::operator<<(poVar9,*(char *)(in_RSI + 4));
            poVar9 = ::std::operator<<(poVar9,local_1d0);
            poVar9 = ::std::operator<<(poVar9,(string *)local_2a8);
            ::std::operator<<(poVar9," Options\n");
          }
        }
      }
      std::function<bool_(const_CLI::Option_*)>::function
                ((function<bool_(const_CLI::Option_*)> *)
                 CONCAT17(in_stack_fffffffffffff517,
                          CONCAT16(in_stack_fffffffffffff516,in_stack_fffffffffffff510)));
      App::get_options(in_stack_fffffffffffff6b8,
                       (function<bool_(const_CLI::Option_*)> *)in_stack_fffffffffffff6b0);
      std::function<bool_(const_CLI::Option_*)>::~function
                ((function<bool_(const_CLI::Option_*)> *)0x121396);
      local_2b0 = local_2c8;
      local_2f0[0]._M_current =
           (Option **)
           std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::begin
                     ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                      CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      local_2f8 = (Option **)
                  std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::end
                            ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                             CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                            *)CONCAT17(in_stack_fffffffffffff517,
                                       CONCAT16(in_stack_fffffffffffff516,in_stack_fffffffffffff510)
                                      ),
                           (__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                            *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
        if (!bVar1) break;
        ppOVar3 = __gnu_cxx::
                  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                  ::operator*(local_2f0);
        local_308 = *ppOVar3;
        bVar1 = OptionBase<CLI::Option>::get_configurable(&local_308->super_OptionBase<CLI::Option>)
        ;
        if (bVar1) {
          OptionBase<CLI::Option>::get_group_abi_cxx11_(&local_308->super_OptionBase<CLI::Option>);
          bVar1 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT17(in_stack_fffffffffffff517,
                                                CONCAT16(in_stack_fffffffffffff516,
                                                         in_stack_fffffffffffff510)),
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508)
                                   );
          if (bVar1) {
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(in_stack_fffffffffffff517,
                                                  CONCAT16(in_stack_fffffffffffff516,
                                                           in_stack_fffffffffffff510)),
                                      (char *)CONCAT44(in_stack_fffffffffffff50c,
                                                       in_stack_fffffffffffff508));
            if (bVar1) {
              OptionBase<CLI::Option>::get_group_abi_cxx11_
                        (&local_308->super_OptionBase<CLI::Option>);
              uVar5 = ::std::__cxx11::string::empty();
              if ((uVar5 & 1) != 0) goto LAB_0012150e;
            }
          }
          else {
LAB_0012150e:
            psVar7 = Option::get_single_name_abi_cxx11_
                               ((Option *)
                                CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
            ::std::__cxx11::string::string(local_328,(string *)psVar7);
            uVar5 = ::std::__cxx11::string::empty();
            if ((uVar5 & 1) == 0) {
              Option::reduced_results_abi_cxx11_(in_stack_fffffffffffff558);
              in_stack_fffffffffffff508 = (int)*(char *)((long)in_RSI + 0x26);
              detail::ini_join(in_stack_fffffffffffff598,
                               (char)((ulong)in_stack_fffffffffffff590 >> 0x38),
                               (char)((ulong)in_stack_fffffffffffff590 >> 0x30),
                               (char)((ulong)in_stack_fffffffffffff590 >> 0x28),
                               (char)((ulong)in_stack_fffffffffffff590 >> 0x20),
                               (char)in_stack_fffffffffffff5b0);
              local_361 = 0;
              uVar5 = ::std::__cxx11::string::empty();
              if (((uVar5 & 1) != 0) && ((local_19 & 1) != 0)) {
                Option::get_default_str_abi_cxx11_
                          ((Option *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
                bVar11 = ::std::__cxx11::string::empty();
                ::std::__cxx11::string::~string(local_388);
                if (((bVar11 ^ 0xff) & 1) == 0) {
                  iVar2 = Option::get_expected_min(local_308);
                  if (iVar2 == 0) {
                    ::std::__cxx11::string::operator=(local_360,"false");
                  }
                  else {
                    bVar1 = Option::get_run_callback_for_default(local_308);
                    if (!bVar1) {
                      bVar1 = OptionBase<CLI::Option>::get_required
                                        (&local_308->super_OptionBase<CLI::Option>);
                      if (bVar1) {
                        ::std::__cxx11::string::operator=(local_360,"\"<REQUIRED>\"");
                        goto LAB_001217c0;
                      }
                    }
                    ::std::__cxx11::string::operator=(local_360,"\"\"");
                  }
                }
                else {
                  Option::get_default_str_abi_cxx11_
                            ((Option *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508)
                            );
                  detail::convert_arg_for_ini
                            (in_stack_fffffffffffff778,in_stack_fffffffffffff777,
                             in_stack_fffffffffffff776,(bool)in_stack_fffffffffffff775);
                  ::std::__cxx11::string::operator=(local_360,local_3a8);
                  ::std::__cxx11::string::~string(local_3a8);
                  ::std::__cxx11::string::~string(local_3c8);
                }
LAB_001217c0:
                local_361 = 1;
              }
              uVar5 = ::std::__cxx11::string::empty();
              if ((uVar5 & 1) == 0) {
                in_stack_fffffffffffff6b8 = (App *)Option::get_fnames_abi_cxx11_(local_308);
                bVar1 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)in_stack_fffffffffffff520);
                if (!bVar1) {
                  in_stack_fffffffffffff6b0 = local_308;
                  ::std::__cxx11::string::string(local_408,local_360);
                  Option::get_flag_value
                            (in_stack_fffffffffffff698,in_stack_fffffffffffff690,
                             in_stack_fffffffffffff688);
                  ::std::__cxx11::string::operator=(local_360,local_3e8);
                  ::std::__cxx11::string::~string(local_3e8);
                  ::std::__cxx11::string::~string(local_408);
                }
                if ((local_1a & 1) != 0) {
                  bVar1 = Option::has_description((Option *)0x121b80);
                  if (bVar1) {
                    auVar10 = ::std::ostream::tellp();
                    local_4b0 = auVar10;
                    std::fpos<__mbstate_t>::fpos
                              ((fpos<__mbstate_t> *)
                               CONCAT17(in_stack_fffffffffffff517,
                                        CONCAT16(in_stack_fffffffffffff516,in_stack_fffffffffffff510
                                                )),
                               CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
                    bVar1 = ::std::operator!=((fpos<__mbstate_t> *)
                                              CONCAT17(in_stack_fffffffffffff517,
                                                       CONCAT16(in_stack_fffffffffffff516,
                                                                in_stack_fffffffffffff510)),
                                              (fpos<__mbstate_t> *)
                                              CONCAT44(in_stack_fffffffffffff50c,
                                                       in_stack_fffffffffffff508));
                    if (bVar1) {
                      ::std::operator<<((ostream *)local_1a0,'\n');
                    }
                    poVar9 = ::std::operator<<((ostream *)local_1a0,local_1d0);
                    psVar7 = Option::get_description_abi_cxx11_(local_308);
                    ::std::__cxx11::string::string(local_500,(string *)psVar7);
                    detail::fix_newlines(in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0);
                    poVar9 = ::std::operator<<(poVar9,local_4e0);
                    ::std::operator<<(poVar9,'\n');
                    ::std::__cxx11::string::~string(local_4e0);
                    ::std::__cxx11::string::~string(local_500);
                  }
                }
                clean_name_string(in_stack_fffffffffffff530,
                                  (string *)
                                  CONCAT17(in_stack_fffffffffffff52f,
                                           CONCAT16(in_stack_fffffffffffff52e,
                                                    in_stack_fffffffffffff528)));
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff538,in_stack_fffffffffffff530);
                if (((*(byte *)((long)in_RSI + 0x29) & 1) != 0) && ((local_361 & 1) != 0)) {
                  ::std::operator+((char)((ulong)in_stack_fffffffffffff548 >> 0x38),
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffff547,
                                               CONCAT16(in_stack_fffffffffffff546,
                                                        in_stack_fffffffffffff540)));
                  ::std::__cxx11::string::operator=(local_520,local_540);
                  ::std::__cxx11::string::~string(local_540);
                }
                poVar9 = ::std::operator<<((ostream *)local_1a0,local_520);
                poVar9 = ::std::operator<<(poVar9,*(char *)((long)in_RSI + 0x24));
                poVar9 = ::std::operator<<(poVar9,local_360);
                ::std::operator<<(poVar9,'\n');
                ::std::__cxx11::string::~string(local_520);
              }
              ::std::__cxx11::string::~string(local_360);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff520);
              local_2fc = 0;
            }
            else {
              local_2fc = 5;
            }
            ::std::__cxx11::string::~string(local_328);
          }
        }
        __gnu_cxx::
        __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
        ::operator++(local_2f0);
      }
      local_2fc = 4;
      std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector
                ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                 in_stack_fffffffffffff520);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_298);
  }
  std::function<bool_(const_CLI::App_*)>::function
            ((function<bool_(const_CLI::App_*)> *)
             CONCAT17(in_stack_fffffffffffff517,
                      CONCAT16(in_stack_fffffffffffff516,in_stack_fffffffffffff510)));
  App::get_subcommands(in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0);
  std::function<bool_(const_CLI::App_*)>::~function((function<bool_(const_CLI::App_*)> *)0x121f64);
  local_580 = local_558;
  local_588._M_current =
       (App **)std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::begin
                         ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
                          CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
  local_590 = (App **)std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::end
                                ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
                                 CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                        *)CONCAT17(in_stack_fffffffffffff517,
                                   CONCAT16(in_stack_fffffffffffff516,in_stack_fffffffffffff510)),
                       (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                        *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
    if (!bVar1) break;
    ppAVar4 = __gnu_cxx::
              __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
              ::operator*(&local_588);
    local_598 = *ppAVar4;
    App::get_name_abi_cxx11_(local_598);
    uVar5 = ::std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      if ((local_19 & 1) == 0) {
        sVar6 = App::count_all(in_stack_fffffffffffff550);
        if (sVar6 == 0) goto LAB_0012224f;
      }
      if ((local_1a & 1) != 0) {
        App::get_group_abi_cxx11_(local_598);
        uVar5 = ::std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          poVar9 = ::std::operator<<((ostream *)local_1a0,'\n');
          poVar9 = ::std::operator<<(poVar9,local_1d0);
          psVar7 = App::get_group_abi_cxx11_(local_598);
          poVar9 = ::std::operator<<(poVar9,(string *)psVar7);
          ::std::operator<<(poVar9," Options\n");
        }
      }
      bVar12 = local_19;
      bVar11 = local_1a;
      pAVar8 = local_598;
      in_stack_fffffffffffff5d8 = local_1a0;
      ::std::__cxx11::string::string(local_5d8,in_R9);
      (**(code **)*in_RSI)(local_5b8,in_RSI,pAVar8,bVar12 & 1,bVar11 & 1,local_5d8);
      ::std::operator<<((ostream *)in_stack_fffffffffffff5d8,local_5b8);
      ::std::__cxx11::string::~string(local_5b8);
      ::std::__cxx11::string::~string(local_5d8);
    }
LAB_0012224f:
    __gnu_cxx::
    __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
    ::operator++(&local_588);
  }
  local_5e0 = local_558;
  local_5e8._M_current =
       (App **)std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::begin
                         ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
                          CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
  local_5f0 = (App **)std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::end
                                ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
                                 CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                        *)CONCAT17(in_stack_fffffffffffff517,
                                   CONCAT16(in_stack_fffffffffffff516,in_stack_fffffffffffff510)),
                       (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                        *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
    if (!bVar1) {
      local_7a9 = 0;
      bVar11 = 0;
      if ((local_1a & 1) != 0) {
        ::std::__cxx11::stringstream::str();
        local_7a9 = 1;
        bVar11 = ::std::__cxx11::string::empty();
        bVar11 = bVar11 ^ 0xff;
      }
      bVar12 = bVar11;
      if ((local_7a9 & 1) != 0) {
        ::std::__cxx11::string::~string(local_7a8);
      }
      if ((bVar11 & 1) == 0) {
        ::std::__cxx11::stringstream::str();
        local_2fc = 1;
      }
      else {
        ::std::operator+((char)((ulong)in_stack_fffffffffffff548 >> 0x38),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff547,
                                  CONCAT16(in_stack_fffffffffffff546,in_stack_fffffffffffff540)));
        ::std::operator+((char)((ulong)in_stack_fffffffffffff548 >> 0x38),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff547,
                                  CONCAT16(in_stack_fffffffffffff546,in_stack_fffffffffffff540)));
        App::get_description_abi_cxx11_
                  ((App *)CONCAT44(in_stack_fffffffffffff50c,in_stack_fffffffffffff508));
        detail::fix_newlines(in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0);
        ::std::operator+(in_stack_fffffffffffff548,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff547,
                                  CONCAT16(in_stack_fffffffffffff546,in_stack_fffffffffffff540)));
        ::std::operator+(in_stack_fffffffffffff518._M_current,bVar12);
        ::std::__cxx11::string::~string(local_7f0);
        ::std::__cxx11::string::~string(local_830);
        ::std::__cxx11::string::~string(local_870);
        ::std::__cxx11::string::~string(local_850);
        ::std::__cxx11::string::~string(local_810);
        ::std::__cxx11::stringstream::str();
        ::std::operator+(in_stack_fffffffffffff518._M_current,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(bVar12,CONCAT16(bVar11,in_stack_fffffffffffff510)));
        ::std::__cxx11::string::~string(local_890);
        local_2fc = 1;
        ::std::__cxx11::string::~string(local_7d0);
      }
      std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~vector
                ((vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *)
                 in_stack_fffffffffffff520);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff520);
      ::std::__cxx11::string::~string(local_228);
      ::std::__cxx11::string::~string(local_200);
      ::std::__cxx11::string::~string(local_1d0);
      ::std::__cxx11::stringstream::~stringstream(local_1b0);
      return in_RDI;
    }
    ppAVar4 = __gnu_cxx::
              __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
              ::operator*(&local_5e8);
    local_5f8 = *ppAVar4;
    in_stack_fffffffffffff5d0 = App::get_name_abi_cxx11_(local_5f8);
    uVar5 = ::std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      if ((local_19 & 1) == 0) {
        sVar6 = App::count_all(in_stack_fffffffffffff550);
        if (sVar6 == 0) goto LAB_00122a30;
      }
      psVar7 = App::get_name_abi_cxx11_(local_5f8);
      ::std::__cxx11::string::string(local_618,(string *)psVar7);
      clean_name_string(in_stack_fffffffffffff530,
                        (string *)
                        CONCAT17(in_stack_fffffffffffff52f,
                                 CONCAT16(in_stack_fffffffffffff52e,in_stack_fffffffffffff528)));
      bVar1 = App::get_configurable(local_5f8);
      if (bVar1) {
        if ((local_19 & 1) == 0) {
          bVar1 = App::got_subcommand((App *)CONCAT17(in_stack_fffffffffffff517,
                                                      CONCAT16(in_stack_fffffffffffff516,
                                                               in_stack_fffffffffffff510)),
                                      (App *)CONCAT44(in_stack_fffffffffffff50c,
                                                      in_stack_fffffffffffff508));
          if (!bVar1) goto LAB_001228b7;
        }
        uVar5 = ::std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
LAB_00122410:
          poVar9 = ::std::operator<<((ostream *)local_1a0,'[');
          poVar9 = ::std::operator<<(poVar9,in_R9);
          poVar9 = ::std::operator<<(poVar9,local_618);
          ::std::operator<<(poVar9,"]\n");
        }
        else {
          pAVar8 = App::get_parent(local_18);
          if (pAVar8 == (App *)0x0) goto LAB_00122410;
          psVar7 = App::get_name_abi_cxx11_(local_18);
          ::std::__cxx11::string::string(local_638,(string *)psVar7);
          clean_name_string(in_stack_fffffffffffff530,
                            (string *)
                            CONCAT17(in_stack_fffffffffffff52f,
                                     CONCAT16(in_stack_fffffffffffff52e,in_stack_fffffffffffff528)))
          ;
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff52f,
                                    CONCAT16(in_stack_fffffffffffff52e,in_stack_fffffffffffff528)),
                           (char)((ulong)in_stack_fffffffffffff520 >> 0x38));
          ::std::operator+(in_stack_fffffffffffff518._M_current,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffff517,
                                    CONCAT16(in_stack_fffffffffffff516,in_stack_fffffffffffff510)));
          ::std::__cxx11::string::operator=(local_618,local_658);
          ::std::__cxx11::string::~string(local_658);
          ::std::__cxx11::string::~string(local_678);
          local_680 = App::get_parent(local_18);
          while( true ) {
            pAVar8 = App::get_parent(local_680);
            if (pAVar8 == (App *)0x0) break;
            psVar7 = App::get_name_abi_cxx11_(local_680);
            ::std::__cxx11::string::string(local_6a0,(string *)psVar7);
            clean_name_string(in_stack_fffffffffffff530,
                              (string *)
                              CONCAT17(in_stack_fffffffffffff52f,
                                       CONCAT16(in_stack_fffffffffffff52e,in_stack_fffffffffffff528)
                                      ));
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff52f,
                                      CONCAT16(in_stack_fffffffffffff52e,in_stack_fffffffffffff528))
                             ,(char)((ulong)in_stack_fffffffffffff520 >> 0x38));
            ::std::operator+(in_stack_fffffffffffff518._M_current,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT17(in_stack_fffffffffffff517,
                                      CONCAT16(in_stack_fffffffffffff516,in_stack_fffffffffffff510))
                            );
            ::std::__cxx11::string::operator=(local_618,local_6c0);
            ::std::__cxx11::string::~string(local_6c0);
            ::std::__cxx11::string::~string(local_6e0);
            local_680 = App::get_parent(local_680);
            ::std::__cxx11::string::~string(local_6a0);
          }
          poVar9 = ::std::operator<<((ostream *)local_1a0,'[');
          in_stack_fffffffffffff550 = (App *)::std::operator<<(poVar9,local_618);
          ::std::operator<<((ostream *)in_stack_fffffffffffff550,"]\n");
          ::std::__cxx11::string::~string(local_638);
        }
        in_stack_fffffffffffff530 = local_1a0;
        in_stack_fffffffffffff548 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_721;
        in_stack_fffffffffffff538 = local_5f8;
        in_stack_fffffffffffff546 = local_19;
        in_stack_fffffffffffff547 = local_1a;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)(local_721 + 1),"",(allocator *)in_stack_fffffffffffff548);
        (**(code **)*in_RSI)
                  (local_700,in_RSI,in_stack_fffffffffffff538,in_stack_fffffffffffff546 & 1,
                   in_stack_fffffffffffff547 & 1,local_721 + 1);
        ::std::operator<<((ostream *)in_stack_fffffffffffff530,local_700);
        ::std::__cxx11::string::~string(local_700);
        ::std::__cxx11::string::~string((string *)(local_721 + 1));
        ::std::allocator<char>::~allocator((allocator<char> *)local_721);
      }
      else {
LAB_001228b7:
        in_stack_fffffffffffff518._M_current = local_1a0;
        in_stack_fffffffffffff520 = local_5f8;
        in_stack_fffffffffffff52e = local_19;
        in_stack_fffffffffffff52f = local_1a;
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff538,in_stack_fffffffffffff530);
        ::std::operator+(in_stack_fffffffffffff518._M_current,in_stack_fffffffffffff517);
        (**(code **)*in_RSI)
                  (local_748,in_RSI,in_stack_fffffffffffff520,in_stack_fffffffffffff52e & 1,
                   in_stack_fffffffffffff52f & 1,local_768);
        ::std::operator<<((ostream *)in_stack_fffffffffffff518._M_current,local_748);
        ::std::__cxx11::string::~string(local_748);
        ::std::__cxx11::string::~string(local_768);
        ::std::__cxx11::string::~string(local_788);
      }
      ::std::__cxx11::string::~string(local_618);
    }
LAB_00122a30:
    __gnu_cxx::
    __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
    ::operator++(&local_5e8);
  } while( true );
}

Assistant:

CLI11_INLINE std::string
ConfigBase::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    std::string commentLead;
    commentLead.push_back(commentChar);
    commentLead.push_back(' ');

    std::string commentTest = "#;";
    commentTest.push_back(commentChar);
    commentTest.push_back(parentSeparatorChar);

    std::string keyChars = commentTest;
    keyChars.push_back(literalQuote);
    keyChars.push_back(stringQuote);
    keyChars.push_back(arrayStart);
    keyChars.push_back(arrayEnd);
    keyChars.push_back(valueDelimiter);
    keyChars.push_back(arraySeparator);

    std::vector<std::string> groups = app->get_groups();
    bool defaultUsed = false;
    groups.insert(groups.begin(), std::string("options"));

    for(auto &group : groups) {
        if(group == "options" || group.empty()) {
            if(defaultUsed) {
                continue;
            }
            defaultUsed = true;
        }
        if(write_description && group != "options" && !group.empty()) {
            out << '\n' << commentChar << commentLead << group << " Options\n";
        }
        for(const Option *opt : app->get_options({})) {
            // Only process options that are configurable
            if(opt->get_configurable()) {
                if(opt->get_group() != group) {
                    if(!(group == "options" && opt->get_group().empty())) {
                        continue;
                    }
                }
                std::string single_name = opt->get_single_name();
                if(single_name.empty()) {
                    continue;
                }

                auto results = opt->reduced_results();
                std::string value =
                    detail::ini_join(results, arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);

                bool isDefault = false;
                if(value.empty() && default_also) {
                    if(!opt->get_default_str().empty()) {
                        value = detail::convert_arg_for_ini(opt->get_default_str(), stringQuote, literalQuote, false);
                    } else if(opt->get_expected_min() == 0) {
                        value = "false";
                    } else if(opt->get_run_callback_for_default() || !opt->get_required()) {
                        value = "\"\"";  // empty string default value
                    } else {
                        value = "\"<REQUIRED>\"";
                    }
                    isDefault = true;
                }

                if(!value.empty()) {
                    if(!opt->get_fnames().empty()) {
                        try {
                            value = opt->get_flag_value(single_name, value);
                        } catch(const CLI::ArgumentMismatch &) {
                            bool valid{false};
                            for(const auto &test_name : opt->get_fnames()) {
                                try {
                                    value = opt->get_flag_value(test_name, value);
                                    single_name = test_name;
                                    valid = true;
                                } catch(const CLI::ArgumentMismatch &) {
                                    continue;
                                }
                            }
                            if(!valid) {
                                value = detail::ini_join(
                                    opt->results(), arraySeparator, arrayStart, arrayEnd, stringQuote, literalQuote);
                            }
                        }
                    }
                    if(write_description && opt->has_description()) {
                        if(out.tellp() != std::streampos(0)) {
                            out << '\n';
                        }
                        out << commentLead << detail::fix_newlines(commentLead, opt->get_description()) << '\n';
                    }
                    clean_name_string(single_name, keyChars);

                    std::string name = prefix + single_name;
                    if(commentDefaultsBool && isDefault) {
                        name = commentChar + name;
                    }
                    out << name << valueDelimiter << value << '\n';
                }
            }
        }
    }

    auto subcommands = app->get_subcommands({});
    for(const App *subcom : subcommands) {
        if(subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            if(write_description && !subcom->get_group().empty()) {
                out << '\n' << commentLead << subcom->get_group() << " Options\n";
            }
            /*if (!prefix.empty() || app->get_parent() == nullptr) {
                out << '[' << prefix << "___"<< subcom->get_group() << "]\n";
            } else {
                std::string subname = app->get_name() + parentSeparatorChar + "___"+subcom->get_group();
                const auto *p = app->get_parent();
                while(p->get_parent() != nullptr) {
                    subname = p->get_name() + parentSeparatorChar +subname;
                    p = p->get_parent();
                }
                out << '[' << subname << "]\n";
            }
            */
            out << to_config(subcom, default_also, write_description, prefix);
        }
    }

    for(const App *subcom : subcommands) {
        if(!subcom->get_name().empty()) {
            if(!default_also && (subcom->count_all() == 0)) {
                continue;
            }
            std::string subname = subcom->get_name();
            clean_name_string(subname, keyChars);

            if(subcom->get_configurable() && (default_also || app->got_subcommand(subcom))) {
                if(!prefix.empty() || app->get_parent() == nullptr) {

                    out << '[' << prefix << subname << "]\n";
                } else {
                    std::string appname = app->get_name();
                    clean_name_string(appname, keyChars);
                    subname = appname + parentSeparatorChar + subname;
                    const auto *p = app->get_parent();
                    while(p->get_parent() != nullptr) {
                        std::string pname = p->get_name();
                        clean_name_string(pname, keyChars);
                        subname = pname + parentSeparatorChar + subname;
                        p = p->get_parent();
                    }
                    out << '[' << subname << "]\n";
                }
                out << to_config(subcom, default_also, write_description, "");
            } else {
                out << to_config(subcom, default_also, write_description, prefix + subname + parentSeparatorChar);
            }
        }
    }

    if(write_description && !out.str().empty()) {
        std::string outString =
            commentChar + commentLead + detail::fix_newlines(commentChar + commentLead, app->get_description()) + '\n';
        return outString + out.str();
    }
    return out.str();
}